

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void discardBlockComment(void)

{
  int iVar1;
  int c;
  
  lexerState->disableMacroArgs = true;
  lexerState->disableInterpolation = true;
LAB_00111b14:
  do {
    iVar1 = nextChar();
    switch(iVar1) {
    case 0xd:
      handleCRLF(iVar1);
    case 10:
      if (lexerState->expansions == (Expansion *)0x0) {
        nextLine();
      }
      break;
    case 0x2a:
      iVar1 = peek();
      if (iVar1 == 0x2f) {
        shiftChar();
        goto LAB_00111ba7;
      }
    default:
      break;
    case 0x2f:
      goto switchD_00111b3e_caseD_2f;
    case -1:
      error("Unterminated block comment\n");
LAB_00111ba7:
      lexerState->disableMacroArgs = false;
      lexerState->disableInterpolation = false;
      return;
    }
  } while( true );
switchD_00111b3e_caseD_2f:
  iVar1 = peek();
  if (iVar1 == 0x2a) {
    warning(WARNING_NESTED_COMMENT,"/* in block comment\n");
  }
  goto LAB_00111b14;
}

Assistant:

static void discardBlockComment(void)
{
	lexerState->disableMacroArgs = true;
	lexerState->disableInterpolation = true;
	for (;;) {
		int c = nextChar();

		switch (c) {
		case EOF:
			error("Unterminated block comment\n");
			goto finish;
		case '\r':
			// Handle CRLF before nextLine() since shiftChar updates colNo
			handleCRLF(c);
			// fallthrough
		case '\n':
			if (!lexerState->expansions)
				nextLine();
			continue;
		case '/':
			if (peek() == '*') {
				warning(WARNING_NESTED_COMMENT,
					"/* in block comment\n");
			}
			continue;
		case '*':
			if (peek() == '/') {
				shiftChar();
				goto finish;
			}
			// fallthrough
		default:
			continue;
		}
	}
finish:
	lexerState->disableMacroArgs = false;
	lexerState->disableInterpolation = false;
}